

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O0

void __thiscall FGLRenderer::SetFixedColormap(FGLRenderer *this,player_t *player)

{
  player_t *ppVar1;
  bool bVar2;
  AActor *pAVar3;
  AInventory *pAStack_28;
  PalEntry color;
  AInventory *in;
  player_t *cplayer;
  player_t *player_local;
  FGLRenderer *this_local;
  
  gl_fixedcolormap = 0;
  pAVar3 = TObjPtr<AActor>::operator->(&player->camera);
  ppVar1 = pAVar3->player;
  if (ppVar1 != (player_t *)0x0) {
    if (ppVar1->extralight == -0x80000000) {
      gl_fixedcolormap = 1;
      extralight = 0;
    }
    else if (ppVar1->fixedcolormap == -1) {
      if (ppVar1->fixedlightlevel != -1) {
        for (pAStack_28 = ::TObjPtr::operator_cast_to_AInventory_
                                    ((TObjPtr *)&(ppVar1->mo->super_AActor).Inventory);
            pAStack_28 != (AInventory *)0x0;
            pAStack_28 = ::TObjPtr::operator_cast_to_AInventory_
                                   ((TObjPtr *)&(pAStack_28->super_AActor).Inventory)) {
          (*(pAStack_28->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x40])();
          bVar2 = DObject::IsKindOf((DObject *)pAStack_28,APowerTorch::RegistrationInfo.MyClass);
          if (bVar2) {
            gl_fixedcolormap = (int)ppVar1->fixedlightlevel + 0x20000010;
          }
          else {
            bVar2 = DObject::IsKindOf((DObject *)pAStack_28,APowerLightAmp::RegistrationInfo.MyClass
                                     );
            if (bVar2) {
              gl_fixedcolormap = 0x20000000;
            }
          }
        }
      }
    }
    else {
      gl_fixedcolormap = (int)ppVar1->fixedcolormap + 1;
    }
  }
  FRenderState::SetFixedColormap(&gl_RenderState,gl_fixedcolormap);
  return;
}

Assistant:

void FGLRenderer::SetFixedColormap (player_t *player)
{
	gl_fixedcolormap=CM_DEFAULT;

	// check for special colormaps
	player_t * cplayer = player->camera->player;
	if (cplayer) 
	{
		if (cplayer->extralight == INT_MIN)
		{
			gl_fixedcolormap=CM_FIRSTSPECIALCOLORMAP + INVERSECOLORMAP;
			extralight=0;
		}
		else if (cplayer->fixedcolormap != NOFIXEDCOLORMAP)
		{
			gl_fixedcolormap = CM_FIRSTSPECIALCOLORMAP + cplayer->fixedcolormap;
		}
		else if (cplayer->fixedlightlevel != -1)
		{
			for(AInventory * in = cplayer->mo->Inventory; in; in = in->Inventory)
			{
				PalEntry color = in->GetBlend ();

				// Need special handling for light amplifiers 
				if (in->IsKindOf(RUNTIME_CLASS(APowerTorch)))
				{
					gl_fixedcolormap = cplayer->fixedlightlevel + CM_TORCH;
				}
				else if (in->IsKindOf(RUNTIME_CLASS(APowerLightAmp)))
				{
					gl_fixedcolormap = CM_LITE;
				}
			}
		}
	}
	gl_RenderState.SetFixedColormap(gl_fixedcolormap);
}